

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

free_ptr<CLASSWEIGHTS::classweights> scoped_calloc_or_throw<CLASSWEIGHTS::classweights>(void)

{
  classweights *pcVar1;
  _Head_base<0UL,_CLASSWEIGHTS::classweights_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<CLASSWEIGHTS::classweights> fVar2;
  
  pcVar1 = calloc_or_throw<CLASSWEIGHTS::classweights>(1);
  *(undefined8 *)&(pcVar1->weights)._M_h._M_rehash_policy = 0;
  (pcVar1->weights)._M_h._M_buckets = &(pcVar1->weights)._M_h._M_single_bucket;
  (pcVar1->weights)._M_h._M_bucket_count = 1;
  (pcVar1->weights)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pcVar1->weights)._M_h._M_element_count = 0;
  (pcVar1->weights)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pcVar1->weights)._M_h._M_rehash_policy._M_next_resize = 0;
  (pcVar1->weights)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       destroy_free<CLASSWEIGHTS::classweights>;
  *(classweights **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) =
       pcVar1;
  fVar2._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CLASSWEIGHTS::classweights_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  fVar2._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>.
  super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
  _M_head_impl = in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<CLASSWEIGHTS::classweights>)
         fVar2._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}